

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostConfigFlags.cpp
# Opt level: O3

int HostConfigFlags::FindArg(int argc,PWSTR *argv,PCWSTR targetArg,size_t targetArgLen)

{
  int iVar1;
  ulong uVar2;
  
  if (1 < argc) {
    uVar2 = 1;
    do {
      iVar1 = _wcsnicmp(argv[uVar2],targetArg,targetArgLen);
      if (iVar1 == 0) {
        return (int)uVar2;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  return -1;
}

Assistant:

int HostConfigFlags::FindArg(int argc, _In_reads_(argc) PWSTR argv[], PCWSTR targetArg, size_t targetArgLen)
{
    return FindArg(argc, argv, [=](PCWSTR arg) -> bool
    {
        return _wcsnicmp(arg, targetArg, targetArgLen) == 0;
    });
}